

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

atom * updateHydrogenInfo(FILE *outf,atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,
                         atomBins *bbins,int selectedFlag,int mustSaveMainWater)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  residue_t *prVar4;
  bool bVar5;
  FILE *__stream;
  int iVar6;
  atomBins *paVar7;
  atom_t *paVar8;
  atom *paVar9;
  atom *paVar10;
  undefined8 uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  atom *paVar15;
  atom *paVar16;
  atom_t *src;
  bool bVar17;
  bool bVar18;
  byte bVar19;
  float fVar20;
  double dVar21;
  double newlen;
  float fVar22;
  double dVar23;
  int dummy;
  uint local_1fc;
  atom *local_1f8;
  undefined4 local_1ec;
  atom *local_1e8;
  atom *local_1e0;
  point3d *local_1d8;
  uint local_1d0;
  undefined4 local_1cc;
  atomBins *local_1c8;
  atomBins *local_1c0;
  FILE *local_1b8;
  atom *local_1b0;
  atom *local_1a8;
  char *local_1a0;
  atomBins *local_198;
  point3d o2aVec;
  anon_struct_16_2_fa5d6e3e proximity [20];
  
  bVar19 = 0;
  dummy = 0;
  bVar17 = allMovingAtoms != (atom *)0x0;
  bVar18 = bbins != (atomBins *)0x0;
  if (!bVar18) {
    allMovingAtoms = (atom *)0x0;
  }
  bVar5 = bVar18 && bVar17;
  paVar7 = abins;
  if (bVar18 && bVar17) {
    paVar7 = bbins;
  }
  local_1b8 = (FILE *)outf;
  local_1b0 = allMainAtoms;
  local_198 = paVar7;
  if (DumpNewHO == '\x01') {
    paVar7 = (atomBins *)fwrite("@vectorlist {water H?} color= gray\n",0x23,1,(FILE *)outf);
  }
  uVar11 = CONCAT71((int7)((ulong)paVar7 >> 8),1);
  local_1e8 = (atom *)0x0;
  local_1e0 = (atom *)0x0;
  local_1fc = selectedFlag;
  local_1c8 = abins;
  local_1c0 = bbins;
  local_1a8 = allMovingAtoms;
  do {
    src = local_1a8;
    if ((byte)uVar11 != 0) {
      src = local_1b0;
    }
    local_1d0 = (uint)uVar11;
    if (src != (atom *)0x0) {
      do {
        iVar6 = getAtno(src->elem);
        uVar12 = src->flags & selectedFlag;
        paVar10 = src;
        if (iVar6 == 1) {
          if (uVar12 != 0) {
            paVar8 = findTouchingAtoms(src,(atom *)0x0,abins,0.0,0,&dummy);
            if (bVar5) {
              paVar8 = findTouchingAtoms(src,paVar8,bbins,0.0,0,&dummy);
            }
            if (paVar8 != (atom *)0x0) {
              markBonds(src,paVar8,1,1);
              uVar12 = dotType(src,paVar8,(uint)ByNABaseColor);
              if ((uVar12 < 0xc) && ((0xb00U >> (uVar12 & 0x1f) & 1) != 0)) {
                if ((Verbose == '\0') && ((ShowTicks & 1) == 0)) {
                  updateHydrogenInfo_cold_2();
                }
                pbVar1 = (byte *)((long)&src->props + 2);
                *pbVar1 = *pbVar1 | 1;
                if (UsePolarH == '\0') {
                  src->elem = 4;
                  fVar20 = getRadius(4,0);
                  src->radius = fVar20;
                }
                fVar20 = src->occ;
                fVar22 = -fVar20;
                if (-fVar20 <= fVar20) {
                  fVar22 = fVar20;
                }
                if (((fVar22 < 0.25) || (80.0 <= src->bval)) && ((src->props & 0x400) != 0)) {
                  src->elem = 1;
                  src->radius = 0.0;
                }
                do {
                  if ((paVar8->mark == 1) && (iVar6 = getAtno(paVar8->elem), iVar6 != 1)) {
                    fVar20 = src->occ;
                    fVar22 = -fVar20;
                    if (-fVar20 <= fVar20) {
                      fVar22 = fVar20;
                    }
                    if ((0.25 <= fVar22) && (src->bval <= 80.0 && src->bval != 80.0)) {
                      pbVar1 = (byte *)((long)&paVar8->props + 2);
                      *pbVar1 = *pbVar1 & 0xfe;
                    }
                  }
                  paVar8 = paVar8->scratch;
                } while (paVar8 != (atom_t *)0x0);
              }
            }
          }
        }
        else if (uVar12 != 0) {
          uVar12 = src->props;
          uVar2 = src->elem;
          if ((uVar12 >> 10 & 1) == 0) {
            if ((uVar2 < 0xc) && ((0xb00U >> (uVar2 & 0x1f) & 1) != 0)) {
              src->props = uVar12 & 0xfffefbff;
            }
          }
          else if ((uVar12 >> 0x10 & 1) != 0 && uVar2 == 9) {
            paVar8 = src->next;
            if (paVar8 != (atom_t *)0x0) {
              do {
                if (src->r != paVar8->r) break;
                iVar6 = getAtno(paVar8->elem);
                if (((iVar6 == 1) && (src->altConf == paVar8->altConf)) && (0.1 < paVar8->occ)) {
                  pbVar1 = (byte *)((long)&src->props + 2);
                  *pbVar1 = *pbVar1 & 0xfe;
                }
                paVar8 = paVar8->next;
              } while (paVar8 != (atom_t *)0x0);
              uVar12 = src->props;
              if ((uVar12 >> 0x10 & 1) == 0) goto LAB_0012a5c7;
            }
            if ((((mustSaveMainWater != 0 && bVar5) & (byte)uVar11) != 0) &&
               (paVar9 = (atom *)malloc(0x80), paVar9 != (atom *)0x0)) {
              paVar15 = src;
              paVar16 = paVar9;
              for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
                paVar16->next = paVar15->next;
                paVar15 = (atom *)((long)paVar15 + (ulong)bVar19 * -0x10 + 8);
                paVar16 = (atom *)((long)paVar16 + (ulong)bVar19 * -0x10 + 8);
              }
              paVar9->next = local_1e8;
              uVar12 = src->props;
              local_1e8 = paVar9;
            }
            src->props = uVar12 & 0xeffcffff | 0x10020000;
            paVar8 = findTouchingAtoms(src,(atom *)0x0,abins,0.25,0,&dummy);
            if (bVar5) {
              paVar8 = findTouchingAtoms(src,paVar8,bbins,0.25,0,&dummy);
            }
            selectedFlag = local_1fc;
            if (paVar8 != (atom *)0x0) {
              local_1d8 = &src->loc;
              uVar12 = 0;
              do {
                if ((paVar8->props & 0x20000) != 0) {
                  local_1f8 = (atom *)CONCAT44(local_1f8._4_4_,paVar8->radius + 2.0);
                  dVar21 = v3distance(&paVar8->loc,local_1d8);
                  fVar20 = (float)(dVar21 - (double)local_1f8._0_4_);
                  if ((0 < (int)uVar12 & *(byte *)((long)&paVar8->props + 2) >> 2) == 1) {
                    lVar13 = 0;
                    do {
                      lVar3 = *(long *)((long)&proximity[0].a + lVar13);
                      if ((paVar8->r == *(residue_t **)(lVar3 + 0x70)) &&
                         ((*(byte *)(lVar3 + 0x2a) & 4) != 0)) {
                        if (fVar20 < *(float *)((long)&proximity[0].gap + lVar13)) {
                          *(atom_t **)((long)&proximity[0].a + lVar13) = paVar8;
                          *(float *)((long)&proximity[0].gap + lVar13) = fVar20;
                        }
                        goto LAB_0012a2ee;
                      }
                      lVar13 = lVar13 + 0x10;
                    } while ((ulong)uVar12 << 4 != lVar13);
                  }
                  if (uVar12 < 0x14) {
                    proximity[uVar12].a = paVar8;
                    proximity[uVar12].gap = fVar20;
                    uVar12 = uVar12 + 1;
                  }
                }
LAB_0012a2ee:
                paVar8 = paVar8->scratch;
              } while (paVar8 != (atom_t *)0x0);
              abins = local_1c8;
              bbins = local_1c0;
              selectedFlag = local_1fc;
              if (0 < (int)uVar12) {
                local_1a0 = src->atomname;
                lVar13 = 0;
                local_1ec = 0;
                local_1f8 = src;
                do {
                  lVar3 = *(long *)((long)&proximity[0].a + lVar13);
                  if (((*(byte *)(lVar3 + 0x2a) & 2) != 0) &&
                     (paVar10 = (atom *)malloc(0x80), paVar10 != (atom *)0x0)) {
                    paVar9 = src;
                    paVar15 = paVar10;
                    for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
                      paVar15->next = paVar9->next;
                      paVar9 = (atom *)((long)paVar9 + (ulong)bVar19 * -0x10 + 8);
                      paVar15 = (atom *)((long)paVar15 + (ulong)bVar19 * -0x10 + 8);
                    }
                    if (bVar18 && bVar17) {
                      paVar10->next = local_1e0;
                      local_1e0 = paVar10;
                    }
                    else {
                      paVar10->next = local_1f8->next;
                      local_1f8->next = paVar10;
                    }
                    v3sub((vector3d *)(lVar3 + 0x38),local_1d8,&o2aVec);
                    dVar23 = (double)*(float *)((long)&proximity[0].gap + lVar13) + 0.6;
                    newlen = (double)(~-(ulong)(dVar23 < -1.0) & 0x3ff0000000000000 |
                                     (ulong)((uint)(-(ulong)(0.0 < dVar23) >> 0x20) & 0x3ff00000 &
                                            (uint)(-(ulong)(dVar23 < -1.0) >> 0x20)) << 0x20);
                    dVar21 = newlen;
                    if (dVar23 <= 0.0) {
                      dVar21 = dVar23 + 1.0;
                    }
                    if (-1.0 <= dVar23) {
                      newlen = dVar21;
                    }
                    v3scale(&o2aVec,newlen);
                    v3add(local_1d8,&o2aVec,&paVar10->loc);
                    paVar10->nextInBin = (atom_t *)0x0;
                    paVar10->scratch = (atom_t *)0x0;
                    paVar10->elem = 5;
                    fVar20 = getRadius(5,0);
                    paVar10->radius = fVar20;
                    fVar20 = getCovRad(paVar10->elem);
                    paVar10->covRad = fVar20;
                    builtin_strncpy(paVar10->atomname," H? ",5);
                    paVar10->props = paVar10->props & 0xfffcffffU | 0x10000;
                    addNeighbor(paVar10,local_198);
                    if (DumpNewHO == '\x01') {
                      if (3 < DebugLevel) {
                        updateHydrogenInfo_cold_1();
                        local_1ec = local_1cc;
                      }
                      __stream = local_1b8;
                      prVar4 = src->r;
                      fprintf(local_1b8,"{%4.4s%c%3.3s%s%4.4s%c}P %8.3f%8.3f%8.3f\n",(src->loc).x,
                              (src->loc).y,SUB84((src->loc).z,0),local_1a0,
                              (ulong)(uint)(int)src->altConf,prVar4->resname,prVar4->chain,
                              prVar4->Hy36resno,(ulong)(uint)(int)prVar4->resInsCode);
                      prVar4 = paVar10->r;
                      fprintf(__stream,"{%4.4s%c%3.3s%s%4s%c}L %8.3f%8.3f%8.3f\n",(paVar10->loc).x,
                              (paVar10->loc).y,paVar10->atomname,(ulong)(uint)(int)paVar10->altConf,
                              prVar4->resname,prVar4->chain,prVar4->Hy36resno,
                              (ulong)(uint)(int)prVar4->resInsCode);
                    }
                    if (!bVar18 || !bVar17) {
                      local_1f8 = local_1f8->next;
                    }
                  }
                  lVar13 = lVar13 + 0x10;
                  abins = local_1c8;
                  paVar10 = local_1f8;
                  bbins = local_1c0;
                  selectedFlag = local_1fc;
                } while ((ulong)uVar12 << 4 != lVar13);
              }
            }
          }
        }
LAB_0012a5c7:
        src = paVar10->next;
      } while (src != (atom_t *)0x0);
    }
    uVar11 = 0;
    if ((local_1d0 & 1) == 0) {
      if (local_1e0 != (atom *)0x0) {
        do {
          paVar10 = local_1a8;
          if (paVar10 == (atom *)0x0) {
            return local_1e8;
          }
          local_1a8 = paVar10->next;
        } while (paVar10->next != (atom_t *)0x0);
        paVar10->next = local_1e0;
      }
      return local_1e8;
    }
  } while( true );
}

Assistant:

atom* updateHydrogenInfo(FILE *outf, atom *allMainAtoms,   atomBins *abins,
                    atom *allMovingAtoms, atomBins *bbins,
                    int selectedFlag, int mustSaveMainWater)
{/*updateHydrogenInfo*/
   atom *src = NULL, *orig = NULL, *atomList = NULL, *a = NULL;
   atom *newH = NULL, *tempStaticList = NULL, *mainWaterStorage = NULL;
   int type = 0, newHcount = 0, i = 0, whichList = 0;
   int nProx = 0, usesMovingAtoms = FALSE;
   int dummy = FALSE;

   /* Information specific to making sure only one H2O Hydrogen is     */
   /* generated which points into ring atoms on a given aromatic ring. */
   struct {atom  *a; float gap;} proximity[20];

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));
   if (! usesMovingAtoms) { allMovingAtoms = NULL; bbins = NULL; }

   if (DumpNewHO) { fprintf(outf,"@vectorlist {water H?} color= gray\n"); }

   tempStaticList = NULL; /* new hydrogens for MainAtoms when usesMovingAtoms */
   mainWaterStorage = NULL; /* MainAtoms waters when usesMovingAtoms          */

   for(whichList = 0; whichList <= 1; whichList++)
   { /* loop over both lists of atoms */
      for(src = ((whichList==0)?allMainAtoms:allMovingAtoms); src; src = src->next)
      {/*loop over src atoms*/

         /* Note: we have to examine ALL the atoms at this point.        */
         /* Not testing (src->flags & selectedFlag) for H will slow down */
         /* the code but it is neccessary to get the atom types correct. */

         if (isHatom(src->elem))
         { /* fixup Hs in the input */

            atomList = NULL;
            if (src->flags & selectedFlag)
            {
               atomList = findTouchingAtoms(src, NULL, abins, 0.0, 0, &dummy);
               if (usesMovingAtoms)
               {
                  atomList = findTouchingAtoms(src, atomList, bbins, 0.0, 0, &dummy);
               }
            }
            if (atomList)
            {
               markBonds(src, atomList, 1, 1); /*in updateHydrogenInfo()*/
               type = dotType(src, atomList, ByNABaseColor);

               if ( type == atomN || type == atomO || type == atomS )
               {/* bgn: if (atom types) */
                  if(Verbose && ShowTicks)
                  {
                     fprintf(stderr, "%s%d   \r",src->r->resname, src->r->resid);
                  }
                  src->props |= DONOR_PROP; /* polar hydrogens are donors */

                  if (UsePolarH)
                  {
                     src->elem = atomHpolar; /* very important */
                     src->radius = getRadius(src->elem, 0);
                  }
/* there are a more restrictive set of cutoffs in reduce: 0.7 & 40 */
#define H2OoccCUTTOFF   0.25
#define H2ObvalCUTTOFF 80.0
                  if (  (   FABS(src->occ) < H2OoccCUTTOFF
                         || src->bval >= H2ObvalCUTTOFF   )
                      &&(src->props & WATER_PROP)          )
                  {
                     src->elem = ignoreAtom;
                     src->radius = 0.0;
                  } /* ignore low occupancy High B water hydrogens */

                  for(a = atomList; a; a = a->scratch)
                  {
                     /* since we found a hydrogen, then we know */
                     /* that the heavy atom is not the donor    */
                     /* so we can disable that property         */
                     if(    (a->mark == 1)
                        && !(isHatom(a->elem))
                        &&  (FABS(src->occ) >= H2OoccCUTTOFF)
                        &&  (src->bval < H2ObvalCUTTOFF)     )
                     {

                        a->props &= ~DONOR_PROP; /*set to one's complement of ...*/
                     }
                  }
               }/* end: if (atom types) */
            }
         }/* fixup Hs in the input */
         else if (   (src->flags & selectedFlag)  /* fixup water oxygen */
                  && (src->props & WATER_PROP)
                  && (src->elem == atomO)       )
         {/* else if water */ /* fixup water oxygen */

            /*if connected H already found, the DONOR prop will not be set*/
            /*if it is, we look further ahead in this residue for Hs      */
            if (src->props & DONOR_PROP)
            {
               for(a = src->next; a && (src->r == a->r); a = a->next)
               {
                  if (  isHatom(a->elem)
                      && (src->altConf == a->altConf)
                      && (a->occ > 0.1))
                  {
                     src->props &= ~DONOR_PROP; /* turn off donor property */
                  }
               }
            }
            /* if donor flag still set...  */
            if (src->props & DONOR_PROP)
            {/* water O without occupied Hs */

               /* begin clone procedure */
               /* special case for when we want to remember just these waters */
               /* in this state                                               */
               if (mustSaveMainWater && usesMovingAtoms && (whichList==0))
               {
                  atom* waterClone = NULL;
                  waterClone = (atom *)malloc(sizeof(atom));
                  if (waterClone)
                  {
                     *waterClone = *src;
                     waterClone->next = mainWaterStorage; /* add clone to list */
                     mainWaterStorage = waterClone;
                  }
               }
               /* end clone procedure */

               src->props |= AMBIGWATER_PROP; /* this is a water which needs H? added */
               src->props |=  ACCEPTOR_PROP;
               src->props &= ~DONOR_PROP;    /* acceptor, not donor */
               orig = src; /* keep track of the original Oxygen atom */
               atomList = findTouchingAtoms(src, NULL, abins, 0.25, 0, &dummy);
               if (usesMovingAtoms)
               {
                  atomList = findTouchingAtoms(src, atomList, bbins, 0.25, 0, &dummy);
               }
               /* the 0.25 comes from:
                  OxygenVDW(1.4) + 2*probeRad(0.3) == HpolVDW(1.0) + OHBondLen(1.0)
                  and we want a minimum overlap of 0.1 before we consider possible Hs
               */

              /* for each nearby HB acceptor, keep only 1 per aromatic ring */
              nProx = 0;
              for(a = atomList; a; a = a->scratch)
              {
                 if (a->props & ACCEPTOR_PROP)
                 {/* bgn: if acceptor_prop */
                    float hbgap = gapSize(&(a->loc), &(orig->loc), a->radius + 2.0f);
                    int   foundAromRingAtom = FALSE;

                    if (a->props & AROMATIC_PROP)
                    {
                       for (i=0; i < nProx; i++)
                       {
                          if (   a->r == proximity[i].a->r
                              && proximity[i].a->props & AROMATIC_PROP)
                          {

                             if (hbgap < proximity[i].gap)
                             {
                                proximity[i].a = a;
                                proximity[i].gap = hbgap;
                             }
                             foundAromRingAtom = TRUE;
                             break;
                          }
                       }
                    }
                    if (   (!foundAromRingAtom)
                        && nProx < sizeof(proximity)/sizeof(proximity[0]))
                    {
                       proximity[nProx].a = a;
                       proximity[nProx].gap  = hbgap;
                       ++nProx;
                    }
                 }/* end: if acceptor_prop */
              }

              /* build new HOH hydrogens in the direction of each acceptor */
              newHcount = 0;
              for (i=0; i < nProx; i++)
              {/*scan over neighbors*/

                 a = proximity[i].a;

                 if (a->props & ACCEPTOR_PROP)
                 {/*close acceptor! Make a phantom H in the direction of each Acceptor*/
                    newH = (atom *)malloc(sizeof(atom));
                    if (newH)
                    {/*newH allocated, set its parameters*/
                       point3d o2aVec;
                       double waterOHbondLen;

                       *newH = *orig;
                       if (usesMovingAtoms)
                       {
                          newH->next = tempStaticList; /* hook into temp list */
                          tempStaticList = newH;
                       }
                       else
                       {
                          newH->next = src->next; /* hook into list of atoms */
                          src->next  = newH;
                       }

                       v3sub(&(a->loc), &(orig->loc), &o2aVec);
#define BEST_HBOND_OVERLAP 0.6
                       waterOHbondLen = 1.0 +
                       MAX(-1.0, MIN(0.0, proximity[i].gap + BEST_HBOND_OVERLAP));
                       v3scale(&o2aVec, waterOHbondLen);
                       v3add(&(orig->loc), &o2aVec, &(newH->loc));

                       newH->nextInBin= NULL; /* added to bins below */
                       newH->scratch  = NULL;
                       newH->elem     = atomHOd; /*hb-only-dummy, phantom H atom*/
                       newH->radius   = getRadius(newH->elem, 0);
                       newH->covRad   = getCovRad(newH->elem);
                          /*atomprops.h/atomProp AtomTbl covRad*/
                       strcpy(newH->atomname, " H? ");

                       newH->props |=  DONOR_PROP;
                       newH->props &= ~ACCEPTOR_PROP; /* donor, not acceptor */

                       /* *** adding an atom not in input! *** */
                       addNeighbor(newH, (usesMovingAtoms ? bbins : abins));

                       if (DumpNewHO)
                       {
                          if (DebugLevel>3)
                          {
                             fprintf(stderr,
"HETATM%5d  H%-2d%c%3.3s%s%4.4s%c   %8.3f%8.3f%8.3f%6.2f%6.2f      new  H\n",
                                0, ++newHcount, newH->altConf,
                                newH->r->resname, newH->r->chain,
                                newH->r->Hy36resno, newH->r->resInsCode,
                                newH->loc.x, newH->loc.y, newH->loc.z,
                                newH->occ, newH->bval);
                          }
                          fprintf(outf, "{%4.4s%c%3.3s%s%4.4s%c}P %8.3f%8.3f%8.3f\n",
                             orig->atomname, orig->altConf,
                             orig->r->resname, orig->r->chain,
                             orig->r->Hy36resno, orig->r->resInsCode,
                             orig->loc.x, orig->loc.y, orig->loc.z);
                          fprintf(outf, "{%4.4s%c%3.3s%s%4s%c}L %8.3f%8.3f%8.3f\n",
                             newH->atomname, newH->altConf,
                             newH->r->resname, newH->r->chain,
                             newH->r->Hy36resno, newH->r->resInsCode,
                             newH->loc.x, newH->loc.y, newH->loc.z);
                       }

                       if (! usesMovingAtoms)
                       {
                          src = src->next; /* bypass new atom when we iterate */
                                           /* when inserted after src atom    */
                       }
                    }/*newH allocated, set its parameters*/
                 }/*close acceptor! Make a phantom H in the direction of each Acceptor*/
              }/*scan over neighbors*/

            }/* water O without occupied Hs */
         }/* else if water */ /* fixup water oxygen */

         /* non-water polar (N/O/S) atoms in selection list */
         else if (    (src->flags & selectedFlag) && !(src->props & WATER_PROP)
                  &&  (src->elem == atomN || src->elem == atomO || src->elem == atomS))
         {
            /* Remove any DONOR property for non-water non-H            */
            /* polar atoms since the Hydrogen atoms will be the DONORs. */
            /* This was assigned in select.c to facilitate selections.  */

            src->props &= ~DONOR_PROP;
         }
      }/*loop over src atoms */ /* end loop over list of src atoms*/
   }/* loop over both lists of atoms */

   if (tempStaticList)
   {/* new hydrogens for MainAtoms when usesMovingAtoms */
      for(src = allMovingAtoms; src; src = src->next)
      {
         if (src->next == NULL)
         {
            src->next = tempStaticList;
            break; /* make sure we don't continually loop */
         }
      }
   }
   return mainWaterStorage;
}